

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void __thiscall
crnlib::vector<crnlib::vec<6U,_float>_>::resize
          (vector<crnlib::vec<6U,_float>_> *this,uint new_size,bool grow_hint)

{
  undefined1 in_DL;
  uint in_ESI;
  long *in_RDI;
  bool in_stack_ffffffffffffffda;
  bool in_stack_ffffffffffffffdb;
  uint in_stack_ffffffffffffffdc;
  undefined3 in_stack_ffffffffffffffe4;
  uint uVar1;
  
  if (*(uint *)(in_RDI + 1) != in_ESI) {
    if (in_ESI < *(uint *)(in_RDI + 1)) {
      scalar_type<crnlib::vec<6U,_float>_>::destruct_array
                ((vec<6U,_float> *)(*in_RDI + (ulong)in_ESI * 0x18),(int)in_RDI[1] - in_ESI);
    }
    else {
      if (*(uint *)((long)in_RDI + 0xc) < in_ESI) {
        uVar1 = CONCAT13(1,in_stack_ffffffffffffffe4);
        if (in_ESI != (int)in_RDI[1] + 1U) {
          uVar1 = CONCAT13(in_DL,in_stack_ffffffffffffffe4) & 0x1ffffff;
        }
        increase_capacity((vector<crnlib::vec<6U,_float>_> *)CONCAT44(uVar1,in_ESI),
                          in_stack_ffffffffffffffdc,in_stack_ffffffffffffffdb,
                          in_stack_ffffffffffffffda);
      }
      scalar_type<crnlib::vec<6U,_float>_>::construct_array
                ((vec<6U,_float> *)(*in_RDI + (ulong)*(uint *)(in_RDI + 1) * 0x18),
                 in_ESI - (int)in_RDI[1]);
    }
    *(uint *)(in_RDI + 1) = in_ESI;
  }
  return;
}

Assistant:

inline void resize(uint new_size, bool grow_hint = false) {
    if (m_size != new_size) {
      if (new_size < m_size)
        scalar_type<T>::destruct_array(m_p + new_size, m_size - new_size);
      else {
        if (new_size > m_capacity)
          increase_capacity(new_size, (new_size == (m_size + 1)) || grow_hint);

        scalar_type<T>::construct_array(m_p + m_size, new_size - m_size);
      }

      m_size = new_size;
    }
  }